

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  secp256k1_fe *rzr;
  int *piVar7;
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe local_138;
  int local_110;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  
  secp256k1_gej_double_var(&d,a,(secp256k1_fe *)0x0);
  d_ge.infinity = 0;
  d_ge.x.n[0] = d.x.n[0];
  d_ge.x.n[1] = d.x.n[1];
  d_ge.x.n[2] = d.x.n[2];
  d_ge.x.n[3] = d.x.n[3];
  d_ge.x.n[4] = d.x.n[4];
  d_ge.y.n[0] = d.y.n[0];
  d_ge.y.n[1] = d.y.n[1];
  d_ge.y.n[2] = d.y.n[2];
  d_ge.y.n[3] = d.y.n[3];
  d_ge.y.n[4] = d.y.n[4];
  secp256k1_fe_impl_sqr(&zi2,&d.z);
  secp256k1_fe_impl_mul(&zi3,&zi2,&d.z);
  secp256k1_fe_impl_mul(&pre_a->x,&a->x,&zi2);
  secp256k1_fe_impl_mul(&pre_a->y,&a->y,&zi3);
  local_110 = a->infinity;
  pre_a->infinity = local_110;
  zi2.n[4] = (pre_a->x).n[4];
  zi2.n[0] = (pre_a->x).n[0];
  zi2.n[1] = (pre_a->x).n[1];
  zi2.n[2] = (pre_a->x).n[2];
  zi2.n[3] = (pre_a->x).n[3];
  uVar2 = (pre_a->y).n[0];
  uVar3 = (pre_a->y).n[1];
  uVar4 = (pre_a->y).n[2];
  uVar5 = (pre_a->y).n[3];
  uVar1 = (pre_a->y).n[4];
  local_138.n[0] = (a->z).n[0];
  local_138.n[1] = (a->z).n[1];
  local_138.n[2] = (a->z).n[2];
  local_138.n[3] = (a->z).n[3];
  local_138.n[4] = (a->z).n[4];
  zr->n[4] = d.z.n[4];
  zr->n[2] = d.z.n[2];
  zr->n[3] = d.z.n[3];
  zr->n[0] = d.z.n[0];
  zr->n[1] = d.z.n[1];
  piVar7 = &pre_a[1].infinity;
  rzr = zr + 1;
  for (lVar6 = 1; lVar6 < n; lVar6 = lVar6 + 1) {
    secp256k1_gej_add_ge_var((secp256k1_gej *)&zi2,(secp256k1_gej *)&zi2,&d_ge,rzr);
    *piVar7 = 0;
    (((secp256k1_ge *)(piVar7 + -0x14))->x).n[0] = zi2.n[0];
    *(uint64_t *)(piVar7 + -0x12) = zi2.n[1];
    *(uint64_t *)(piVar7 + -0x10) = zi2.n[2];
    *(uint64_t *)(piVar7 + -0xe) = zi2.n[3];
    *(uint64_t *)(piVar7 + -0xc) = zi2.n[4];
    ((secp256k1_fe *)(piVar7 + -10))->n[0] = uVar2;
    *(uint64_t *)(piVar7 + -8) = uVar3;
    *(uint64_t *)(piVar7 + -6) = uVar4;
    *(uint64_t *)(piVar7 + -4) = uVar5;
    *(uint64_t *)(piVar7 + -2) = uVar1;
    piVar7 = piVar7 + 0x16;
    rzr = rzr + 1;
  }
  secp256k1_fe_impl_mul(z,&local_138,&d.z);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equivalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}